

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

Vec_Int_t * Ree_ManDeriveAdds(Hash_IntMan_t *p,Vec_Int_t *vData,int fVerbose)

{
  int iVar1;
  int iVar2;
  int Entry;
  int *piVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  void *pvVar6;
  uint *__ptr;
  uint *__ptr_00;
  void *pvVar7;
  Vec_Int_t *p_01;
  int *piVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar18;
  long lVar19;
  long lVar20;
  size_t __size;
  ulong uVar21;
  Vec_Int_t *p_02;
  int *local_a0;
  uint *local_90;
  void *local_70;
  int iVar17;
  
  iVar18 = p->vObjs->nSize;
  iVar17 = iVar18 + 3;
  if (-1 < iVar18) {
    iVar17 = iVar18;
  }
  uVar16 = iVar17 >> 2;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  uVar11 = 0x10;
  if (0xe < uVar16 - 1) {
    uVar11 = uVar16;
  }
  if (uVar11 == 0) {
    __ptr = (uint *)malloc(0x10);
    *__ptr = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar16;
    __ptr_00 = (uint *)malloc(0x10);
    *__ptr_00 = 0;
    local_70 = (void *)0x0;
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
    __ptr_00[1] = uVar16;
    pvVar6 = (void *)0x0;
  }
  else {
    __size = (long)(int)uVar11 << 2;
    pvVar6 = malloc(__size);
    lVar19 = (long)(int)uVar16;
    if (pvVar6 != (void *)0x0) {
      memset(pvVar6,0,lVar19 * 4);
    }
    __ptr = (uint *)malloc(0x10);
    *__ptr = uVar11;
    local_70 = malloc(__size);
    *(void **)(__ptr + 2) = local_70;
    __ptr[1] = uVar16;
    if (local_70 != (void *)0x0) {
      memset(local_70,0,lVar19 * 4);
    }
    __ptr_00 = (uint *)malloc(0x10);
    *__ptr_00 = uVar11;
    pvVar7 = malloc(__size);
    *(void **)(__ptr_00 + 2) = pvVar7;
    __ptr_00[1] = uVar16;
    if (pvVar7 != (void *)0x0) {
      memset(pvVar7,0xff,lVar19 << 2);
    }
  }
  local_90 = __ptr_00 + 1;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_01->pArray = piVar5;
  iVar17 = vData->nSize;
  if (2 < iVar17) {
    piVar5 = vData->pArray;
    lVar19 = 2;
    do {
      uVar11 = piVar5[lVar19 + -1];
      if ((int)uVar16 <= (int)uVar11) {
        __assert_fail("Value <= nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                      ,0x154,"Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
      }
      uVar14 = piVar5[lVar19] - 0x66;
      pvVar7 = local_70;
      if ((uVar14 < 0x34) && ((0x9000000000009U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
        pvVar7 = pvVar6;
      }
      if ((int)uVar11 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar8 = (int *)((long)pvVar7 + (ulong)uVar11 * 4);
      *piVar8 = *piVar8 + 1;
      lVar19 = lVar19 + 3;
    } while ((int)lVar19 < iVar17);
  }
  if (iVar18 < 4) {
    iVar18 = 0;
    if (pvVar6 != (void *)0x0) goto LAB_0066fbc5;
  }
  else {
    uVar21 = 0;
    iVar18 = 0;
    do {
      if ((long)(int)__ptr[1] <= (long)uVar21) goto LAB_00670043;
      if ((*(int *)((long)pvVar6 + uVar21 * 4) != 0) &&
         (*(int *)(*(long *)(__ptr + 2) + uVar21 * 4) != 0)) {
        Vec_IntPush(p_01,(int)uVar21);
        if ((long)(int)*local_90 <= (long)uVar21) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)(*(long *)(__ptr_00 + 2) + uVar21 * 4) = iVar18;
        iVar18 = iVar18 + 1;
      }
      uVar21 = uVar21 + 1;
    } while (uVar16 != uVar21);
LAB_0066fbc5:
    free(pvVar6);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  piVar5 = (int *)malloc(0x10);
  iVar17 = 8;
  if (6 < iVar18 - 1U) {
    iVar17 = iVar18;
  }
  *piVar5 = iVar17;
  if (iVar17 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)iVar17,0x10);
  }
  *(void **)(piVar5 + 2) = pvVar6;
  piVar5[1] = iVar18;
  piVar8 = (int *)malloc(0x10);
  *piVar8 = iVar17;
  if (iVar17 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)iVar17,0x10);
  }
  *(void **)(piVar8 + 2) = pvVar6;
  piVar8[1] = iVar18;
  if (2 < vData->nSize) {
    lVar19 = 2;
    do {
      piVar3 = vData->pArray;
      iVar17 = piVar3[lVar19 + -1];
      if (((long)iVar17 < 0) || ((int)*local_90 <= iVar17)) {
LAB_00670043:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar11 = *(uint *)(*(long *)(__ptr_00 + 2) + (long)iVar17 * 4);
      if ((ulong)uVar11 != 0xffffffff) {
        iVar17 = piVar3[lVar19];
        uVar16 = iVar17 - 0x66;
        if ((uVar16 < 0x34) && ((0x9000000000009U >> ((ulong)uVar16 & 0x3f) & 1) != 0)) {
          if (((int)uVar11 < 0) || (piVar5[1] <= (int)uVar11)) goto LAB_00670024;
          pvVar7 = *(void **)(piVar5 + 2);
        }
        else if (((int)uVar11 < 0) || (pvVar7 = pvVar6, iVar18 <= (int)uVar11)) goto LAB_00670024;
        p_02 = (Vec_Int_t *)((ulong)uVar11 * 0x10 + (long)pvVar7);
        Vec_IntPush(p_02,piVar3[lVar19 + -2]);
        Vec_IntPush(p_02,iVar17);
      }
      lVar19 = lVar19 + 3;
    } while ((int)lVar19 < vData->nSize);
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  iVar18 = p_01->nSize;
  piVar3 = p_01->pArray;
  if (0 < (long)iVar18) {
    uVar21 = (ulong)(uint)piVar5[1];
    if (piVar5[1] < 1) {
      uVar21 = 0;
    }
    uVar9 = 0;
    do {
      if ((uVar9 == uVar21) || ((long)piVar8[1] <= (long)uVar9)) {
LAB_00670024:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar17 = piVar3[uVar9];
      lVar13 = *(long *)(piVar5 + 2) + uVar9 * 0x10;
      lVar19 = uVar9 * 0x10 + *(long *)(piVar8 + 2);
      if (iVar17 == 0) {
        local_a0 = (int *)0x0;
      }
      else {
        if (iVar17 < 0) {
LAB_00670062:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if (p->vObjs->nSize <= iVar17 * 4) goto LAB_00670062;
        local_a0 = p->vObjs->pArray + (uint)(iVar17 * 4);
      }
      iVar17 = *(int *)(lVar13 + 4);
      if (1 < iVar17) {
        iVar4 = *(int *)(lVar19 + 4);
        lVar15 = 0;
        do {
          if (1 < iVar4) {
            iVar17 = *(int *)(*(long *)(lVar13 + 8) + lVar15 * 4);
            iVar1 = *(int *)(*(long *)(lVar13 + 8) + 4 + lVar15 * 4);
            lVar12 = 0;
            do {
              iVar4 = *(int *)(*(long *)(lVar19 + 8) + lVar12 * 4);
              iVar2 = *(int *)(*(long *)(lVar19 + 8) + 4 + lVar12 * 4);
              piVar10 = &DAT_00a274f0;
              lVar20 = 0;
              do {
                if (iVar2 == *piVar10) goto LAB_0066fe98;
                lVar20 = lVar20 + 1;
                piVar10 = piVar10 + 1;
              } while (lVar20 != 8);
              piVar10 = &DAT_00a274d0;
              lVar20 = 0;
              while (iVar2 != *piVar10) {
                lVar20 = lVar20 + 1;
                piVar10 = piVar10 + 1;
                if (lVar20 == 8) {
                  __assert_fail("n < 8",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                                ,0x186,
                                "Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
                }
              }
LAB_0066fe98:
              iVar2 = local_a0[1];
              Entry = local_a0[2];
              Vec_IntPush(p_00,*local_a0);
              Vec_IntPush(p_00,iVar2);
              Vec_IntPush(p_00,Entry);
              Vec_IntPush(p_00,iVar17);
              Vec_IntPush(p_00,iVar4);
              Vec_IntPush(p_00,(uint)lVar20 | (uint)(iVar1 == 0x69 || iVar1 == 0x99) << 3);
              lVar12 = lVar12 + 2;
              iVar4 = *(int *)(lVar19 + 4);
            } while ((int)((uint)lVar12 | 1) < iVar4);
            iVar17 = *(int *)(lVar13 + 4);
          }
          lVar15 = lVar15 + 2;
        } while ((int)((uint)lVar15 | 1) < iVar17);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (long)iVar18);
  }
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(p_01);
  iVar18 = *piVar5;
  pvVar6 = *(void **)(piVar5 + 2);
  if ((long)iVar18 < 1) {
    if (pvVar6 != (void *)0x0) goto LAB_0066ff8d;
  }
  else {
    lVar19 = 0;
    do {
      pvVar7 = *(void **)((long)pvVar6 + lVar19 + 8);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        *(undefined8 *)((long)pvVar6 + lVar19 + 8) = 0;
      }
      lVar19 = lVar19 + 0x10;
    } while ((long)iVar18 * 0x10 != lVar19);
LAB_0066ff8d:
    free(pvVar6);
  }
  free(piVar5);
  iVar18 = *piVar8;
  pvVar6 = *(void **)(piVar8 + 2);
  if ((long)iVar18 < 1) {
    if (pvVar6 == (void *)0x0) goto LAB_0066ffec;
  }
  else {
    lVar19 = 0;
    do {
      pvVar7 = *(void **)((long)pvVar6 + lVar19 + 8);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        *(undefined8 *)((long)pvVar6 + lVar19 + 8) = 0;
      }
      lVar19 = lVar19 + 0x10;
    } while ((long)iVar18 * 0x10 != lVar19);
  }
  free(pvVar6);
LAB_0066ffec:
  free(piVar8);
  return p_00;
}

Assistant:

Vec_Int_t * Ree_ManDeriveAdds( Hash_IntMan_t * p, Vec_Int_t * vData, int fVerbose )
{
    int i, j, k, iObj, iObj2, Value, Truth, Truth2, CountX, CountM, Index = 0;
    int nEntries = Hash_IntManEntryNum(p);
    Vec_Int_t * vAdds = Vec_IntAlloc( 1000 );
    Vec_Int_t * vXors = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vMajs = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vIndex = Vec_IntStartFull( nEntries + 1 );
    Vec_Int_t * vIndexRev = Vec_IntAlloc( 1000 );
    Vec_Wec_t * vXorMap, * vMajMap;
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        assert( Value <= nEntries );
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntAddToEntry( vXors, Value, 1 );
        else
            Vec_IntAddToEntry( vMajs, Value, 1 );
    }
    // remap these into indexes
    Vec_IntForEachEntryTwo( vXors, vMajs, CountX, CountM, i )
        if ( CountX && CountM )
        {
            Vec_IntPush( vIndexRev, i );
            Vec_IntWriteEntry( vIndex, i, Index++ );
        }
    Vec_IntFree( vXors );
    Vec_IntFree( vMajs );
    //if ( fVerbose )
    //    printf( "Detected %d shared cuts among %d hashed cuts.\n", Index, nEntries );
    // collect nodes
    vXorMap = Vec_WecStart( Index );
    vMajMap = Vec_WecStart( Index );
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        Index = Vec_IntEntry( vIndex, Value );
        if ( Index == -1 )
            continue;
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntPushTwo( Vec_WecEntry(vXorMap, Index), iObj, Truth );
        else
            Vec_IntPushTwo( Vec_WecEntry(vMajMap, Index), iObj, Truth );
    }
    Vec_IntFree( vIndex );
    // create pairs
    Vec_IntForEachEntry( vIndexRev, Value, i )
    {
        Vec_Int_t * vXorOne = Vec_WecEntry( vXorMap, i );
        Vec_Int_t * vMajOne = Vec_WecEntry( vMajMap, i );
        Hash_IntObj_t * pObj = Hash_IntObj( p, Value );
        Vec_IntForEachEntryDouble( vXorOne, iObj, Truth, j )
        Vec_IntForEachEntryDouble( vMajOne, iObj2, Truth2, k )
        {
            int SignAnd[8] = {0x88, 0x44, 0x22, 0x11, 0x77, 0xBB, 0xDD, 0xEE};
            int SignMaj[8] = {0xE8, 0xD4, 0xB2, 0x71, 0x8E, 0x4D, 0x2B, 0x17};
            int n, SignXor = (Truth == 0x99 || Truth == 0x69) << 3;
            for ( n = 0; n < 8; n++ )
                if ( Truth2 == SignMaj[n] )
                    break;
            if ( n == 8 ) 
                for ( n = 0; n < 8; n++ )
                    if ( Truth2 == SignAnd[n] )
                        break;
            assert( n < 8 );
            Vec_IntPushThree( vAdds, pObj->iData0, pObj->iData1, pObj->iData2 ); 
            Vec_IntPushThree( vAdds, iObj, iObj2, SignXor | n );
        }
    }
    Vec_IntFree( vIndexRev );
    Vec_WecFree( vXorMap );
    Vec_WecFree( vMajMap );
    return vAdds;
}